

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O2

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::updateTransitionMatrices
          (EigenDecompositionSquare<float,_1> *this,int eigenIndex,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double *categoryRates,float **transitionMatrices,int count)

{
  float *pfVar1;
  double dVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint *puVar10;
  ulong uVar11;
  ulong uVar12;
  float *pfVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  
  auVar29 = ZEXT1664(ZEXT816(0) << 0x40);
  pfVar3 = this->gIMatrices[eigenIndex];
  pfVar4 = (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex];
  pfVar5 = this->gEMatrices[eigenIndex];
  uVar11 = 0;
  uVar8 = (ulong)(this->super_EigenDecomposition<float,_1>).kStateCount;
  uVar12 = uVar8;
  do {
    if (uVar11 == (uint)(~(count >> 0x1f) & count)) {
      return;
    }
    iVar20 = 0;
    pfVar6 = transitionMatrices[probabilityIndices[uVar11]];
    dVar2 = edgeLengths[uVar11];
    for (lVar19 = 0; lVar19 < (this->super_EigenDecomposition<float,_1>).kCategoryCount;
        lVar19 = lVar19 + 1) {
      fVar22 = (float)(dVar2 * categoryRates[lVar19]);
      for (iVar17 = 0; uVar7 = (uint)uVar12, iVar17 < (int)uVar7; iVar17 = iVar17 + 1) {
        if (this->isComplex == true) {
          fVar23 = pfVar4[uVar8 + (long)iVar17];
          if ((fVar23 == 0.0) && (!NAN(fVar23))) goto LAB_0014722b;
          iVar18 = iVar17 + 1;
          dVar24 = exp((double)(fVar22 * pfVar4[iVar17]));
          dVar25 = cos((double)(fVar22 * fVar23));
          dVar26 = sin((double)(fVar22 * fVar23));
          uVar7 = (this->super_EigenDecomposition<float,_1>).kStateCount;
          pfVar13 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
          lVar15 = (long)(int)(uVar7 * iVar18);
          lVar9 = (long)(int)(iVar17 * uVar7);
          fVar23 = (float)(dVar26 * (double)(float)dVar24);
          for (uVar12 = 0; iVar17 = iVar18, (~((int)uVar7 >> 0x1f) & uVar7) != uVar12;
              uVar12 = uVar12 + 1) {
            auVar28 = ZEXT416((uint)(float)(dVar25 * (double)(float)dVar24));
            auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * pfVar3[lVar15 + uVar12])),auVar28,
                                      ZEXT416((uint)pfVar3[lVar9 + uVar12]));
            pfVar13[lVar9 + uVar12] = auVar27._0_4_;
            auVar27 = vfmsub231ss_fma(ZEXT416((uint)(fVar23 * pfVar3[lVar9 + uVar12])),auVar28,
                                      ZEXT416((uint)pfVar3[lVar15 + uVar12]));
            pfVar13[lVar15 + uVar12] = auVar27._0_4_;
          }
        }
        else {
LAB_0014722b:
          dVar24 = exp((double)(fVar22 * pfVar4[iVar17]));
          uVar7 = (this->super_EigenDecomposition<float,_1>).kStateCount;
          pfVar13 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
          for (uVar12 = 0; (~((int)uVar7 >> 0x1f) & uVar7) != uVar12; uVar12 = uVar12 + 1) {
            pfVar13[(long)(int)(uVar7 * iVar17) + uVar12] =
                 (float)dVar24 * pfVar3[(long)(int)(uVar7 * iVar17) + uVar12];
          }
        }
        uVar12 = (ulong)uVar7;
        auVar29 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      pfVar13 = pfVar5;
      for (uVar14 = 0; uVar14 != (~((int)uVar7 >> 0x1f) & uVar7); uVar14 = uVar14 + 1) {
        lVar9 = (long)iVar20;
        lVar15 = 0;
        for (uVar16 = 0; uVar16 != (uVar12 & 0xffffffff); uVar16 = uVar16 + 1) {
          auVar27 = ZEXT816(0) << 0x40;
          uVar21 = 0;
          puVar10 = (uint *)((long)(this->super_EigenDecomposition<float,_1>).matrixTmp + lVar15);
          while ((uVar12 & 0xffffffff) != uVar21) {
            pfVar1 = pfVar13 + uVar21;
            uVar21 = uVar21 + 1;
            auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)*pfVar1),ZEXT416(*puVar10));
            puVar10 = puVar10 + (int)uVar7;
          }
          auVar27 = vmaxss_avx(auVar27,auVar29._0_16_);
          lVar15 = lVar15 + 4;
          pfVar6[lVar9] = auVar27._0_4_;
          lVar9 = lVar9 + 1;
        }
        pfVar13 = pfVar13 + (int)uVar7;
        pfVar6[(int)lVar9] = 1.0;
        iVar20 = (int)lVar9 + 1;
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatrices(int eigenIndex,
                                                        const int* probabilityIndices,
                                                        const int* firstDerivativeIndices,
                                                        const int* secondDerivativeIndices,
                                                        const double* edgeLengths,
                                                        const double* categoryRates,
                                                        REALTYPE** transitionMatrices,
                                                        int count) {

	const REALTYPE* Ievc = gIMatrices[eigenIndex];
	const REALTYPE* Evec = gEMatrices[eigenIndex];
	const REALTYPE* Eval = gEigenValues[eigenIndex];
	const REALTYPE* EvalImag = Eval + kStateCount;
    for (int u = 0; u < count; u++) {
        REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
        const double edgeLength = edgeLengths[u];
        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {
			const REALTYPE distance = categoryRates[l] * edgeLength;
        	for(int i=0; i<kStateCount; i++) {
        		if (!isComplex || EvalImag[i] == 0) {
        			const REALTYPE tmp = exp(Eval[i] * distance);
        			for(int j=0; j<kStateCount; j++) {
        				matrixTmp[i*kStateCount+j] = Ievc[i*kStateCount+j] * tmp;
        			}
        		} else {
        			// 2 x 2 conjugate block
        			int i2 = i + 1;
        			const REALTYPE b = EvalImag[i];
        			const REALTYPE expat = exp(Eval[i] * distance);
        			const REALTYPE expatcosbt = expat * cos(b * distance);
        			const REALTYPE expatsinbt = expat * sin(b * distance);
        			for(int j=0; j<kStateCount; j++) {
        				matrixTmp[ i*kStateCount+j] = expatcosbt * Ievc[ i*kStateCount+j] +
        						                      expatsinbt * Ievc[i2*kStateCount+j];
        				matrixTmp[i2*kStateCount+j] = expatcosbt * Ievc[i2*kStateCount+j] -
												      expatsinbt * Ievc[ i*kStateCount+j];
        			}
        			i++; // processed two conjugate rows
        		}
        	}

#ifdef DEBUG_COMPLEX
           	fprintf(stderr,"[");
            	for(int i=0; i<16; i++)
            		fprintf(stderr," %7.5e,",matrixTmp[i]);
            	fprintf(stderr,"] -- complex debug\n");
            	exit(0);
#endif


            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {
                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++)
                        sum += Evec[i*kStateCount+k] * matrixTmp[k*kStateCount+j];
                    if (sum > 0)
                        transitionMat[n] = sum;
                    else
                        transitionMat[n] = 0;
                    n++;
                }
if (T_PAD != 0) {
                transitionMat[n] = 1.0;
                n += T_PAD;
}
            }
        }

        if (DEBUGGING_OUTPUT) {
        	int kMatrixSize = kStateCount * kStateCount;
            fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
            for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
        }
    }
}